

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md2.cpp
# Opt level: O3

bool __thiscall FMD2Model::Load(FMD2Model *this,char *path,int lumpnum,char *buffer,int length)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  FTextureID FVar6;
  FTextureID *pFVar7;
  ModelFrame *pMVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  
  (this->super_FDMDModel).header.magic = 0x32504449;
  (this->super_FDMDModel).header.version = 8;
  (this->super_FDMDModel).header.flags = 0;
  (this->super_FDMDModel).info.numLODs = 1;
  auVar2 = *(undefined1 (*) [16])(buffer + 8);
  iVar14 = *(int *)(buffer + 0x10);
  (this->super_FDMDModel).info.skinWidth = auVar2._0_4_;
  (this->super_FDMDModel).info.skinHeight = auVar2._4_4_;
  (this->super_FDMDModel).info.frameSize = auVar2._8_4_;
  (this->super_FDMDModel).info.numSkins = auVar2._12_4_;
  uVar5 = *(undefined8 *)(buffer + 0x18);
  (this->super_FDMDModel).info.numVertices = (int)uVar5;
  (this->super_FDMDModel).info.numTexCoords = (int)((ulong)uVar5 >> 0x20);
  uVar11 = *(uint *)(buffer + 0x28);
  (this->super_FDMDModel).info.numFrames = uVar11;
  uVar5 = *(undefined8 *)(buffer + 0x2c);
  (this->super_FDMDModel).info.offsetSkins = (int)uVar5;
  (this->super_FDMDModel).info.offsetTexCoords = (int)((ulong)uVar5 >> 0x20);
  iVar9 = *(int *)(buffer + 0x38);
  (this->super_FDMDModel).info.offsetFrames = iVar9;
  iVar3 = *(int *)(buffer + 0x40);
  (this->super_FDMDModel).info.offsetLODs = iVar3;
  (this->super_FDMDModel).lodInfo[0].numTriangles = *(int *)(buffer + 0x20);
  iVar4 = *(int *)(buffer + 0x24);
  (this->super_FDMDModel).lodInfo[0].numGlCommands = iVar4;
  (this->super_FDMDModel).lodInfo[0].offsetTriangles = *(int *)(buffer + 0x34);
  (this->super_FDMDModel).lodInfo[0].offsetGlCommands = *(int *)(buffer + 0x3c);
  (this->super_FDMDModel).info.offsetEnd = iVar3;
  if (length < (int)(iVar14 * uVar11 + iVar9)) {
    pcVar12 = "LoadModel: Model \'%s\' file too short\n";
  }
  else {
    if (0 < iVar4) {
      iVar14 = auVar2._12_4_;
      uVar13 = (long)iVar14 * 4;
      if (iVar14 < 0) {
        uVar13 = 0xffffffffffffffff;
      }
      pFVar7 = (FTextureID *)operator_new__(uVar13);
      (this->super_FDMDModel).skins = pFVar7;
      if (0 < iVar14) {
        lVar10 = 0;
        pcVar12 = buffer;
        do {
          FVar6 = LoadSkin(path,pcVar12 + (this->super_FDMDModel).info.offsetSkins);
          (this->super_FDMDModel).skins[lVar10].texnum = FVar6.texnum;
          lVar10 = lVar10 + 1;
          pcVar12 = pcVar12 + 0x40;
        } while (lVar10 < (this->super_FDMDModel).info.numSkins);
        uVar11 = (this->super_FDMDModel).info.numFrames;
        iVar9 = (this->super_FDMDModel).info.offsetFrames;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(int)uVar11;
      uVar13 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x14),8) == 0) {
        uVar13 = SUB168(auVar2 * ZEXT816(0x14),0);
      }
      pMVar8 = (ModelFrame *)operator_new__(uVar13);
      (this->super_FDMDModel).frames = pMVar8;
      if (0 < (int)uVar11) {
        pcVar12 = buffer + (long)iVar9 + 0x18;
        iVar14 = (this->super_FDMDModel).info.frameSize;
        lVar10 = 0;
        do {
          uVar5 = *(undefined8 *)(pcVar12 + 8);
          *(undefined8 *)(pMVar8->name + lVar10) = *(undefined8 *)pcVar12;
          *(undefined8 *)(pMVar8->name + lVar10 + 8) = uVar5;
          pcVar1 = pMVar8->name + lVar10 + 0x10;
          pcVar1[0] = -1;
          pcVar1[1] = -1;
          pcVar1[2] = -1;
          pcVar1[3] = -1;
          pcVar12 = pcVar12 + iVar14;
          lVar10 = lVar10 + 0x14;
        } while ((ulong)uVar11 * 0x14 != lVar10);
      }
      (this->super_FDMDModel).mLumpNum = lumpnum;
      return true;
    }
    pcVar12 = "LoadModel: Model \'%s\' invalid NumGLCommands\n";
  }
  Printf(pcVar12,path);
  return false;
}

Assistant:

bool FMD2Model::Load(const char * path, int lumpnum, const char * buffer, int length)
{
	md2_header_t * md2header = (md2_header_t *)buffer;
	ModelFrame *frame;
	byte   *md2_frames;
	int     i;

	// Convert it to DMD.
	header.magic = MD2_MAGIC;
	header.version = 8;
	header.flags = 0;
	info.skinWidth = LittleLong(md2header->skinWidth);
	info.skinHeight = LittleLong(md2header->skinHeight);
	info.frameSize = LittleLong(md2header->frameSize);
	info.numLODs = 1;
	info.numSkins = LittleLong(md2header->numSkins);
	info.numTexCoords = LittleLong(md2header->numTexCoords);
	info.numVertices = LittleLong(md2header->numVertices);
	info.numFrames = LittleLong(md2header->numFrames);
	info.offsetSkins = LittleLong(md2header->offsetSkins);
	info.offsetTexCoords = LittleLong(md2header->offsetTexCoords);
	info.offsetFrames = LittleLong(md2header->offsetFrames);
	info.offsetLODs = LittleLong(md2header->offsetEnd);	// Doesn't exist.
	lodInfo[0].numTriangles = LittleLong(md2header->numTriangles);
	lodInfo[0].numGlCommands = LittleLong(md2header->numGlCommands);
	lodInfo[0].offsetTriangles = LittleLong(md2header->offsetTriangles);
	lodInfo[0].offsetGlCommands = LittleLong(md2header->offsetGlCommands);
	info.offsetEnd = LittleLong(md2header->offsetEnd);

	if (info.offsetFrames + info.frameSize * info.numFrames > length)
	{
		Printf("LoadModel: Model '%s' file too short\n", path);
		return false;
	}
	if (lodInfo[0].numGlCommands <= 0)
	{
		Printf("LoadModel: Model '%s' invalid NumGLCommands\n", path);
		return false;
	}

	skins = new FTextureID[info.numSkins];

	for (i = 0; i < info.numSkins; i++)
	{
		skins[i] = LoadSkin(path, buffer + info.offsetSkins + i * 64);
	}

	// The frames need to be unpacked.
	md2_frames = (byte*)buffer + info.offsetFrames;
	frames = new ModelFrame[info.numFrames];

	for (i = 0, frame = frames; i < info.numFrames; i++, frame++)
	{
		md2_packedFrame_t *pfr = (md2_packedFrame_t *)(md2_frames + info.frameSize * i);

		memcpy(frame->name, pfr->name, sizeof(pfr->name));
		frame->vindex = UINT_MAX;
	}
	mLumpNum = lumpnum;
	return true;
}